

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

bool __thiscall
pybind11::detail::values_and_holders::is_redundant_value_and_holder
          (values_and_holders *this,value_and_holder *vh)

{
  pointer pptVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = vh->index != 0;
  if ((bVar4) &&
     (pptVar1 = (this->tinfo->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
     iVar2 = PyType_IsSubtype((*pptVar1)->type,pptVar1[vh->index]->type), iVar2 == 0)) {
    uVar3 = 1;
    do {
      bVar4 = uVar3 < vh->index;
      if (!bVar4) {
        return bVar4;
      }
      pptVar1 = (this->tinfo->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar2 = PyType_IsSubtype(pptVar1[uVar3]->type,pptVar1[vh->index]->type);
      uVar3 = uVar3 + 1;
    } while (iVar2 == 0);
  }
  return bVar4;
}

Assistant:

bool is_redundant_value_and_holder(const value_and_holder &vh) {
        for (size_t i = 0; i < vh.index; i++) {
            if (PyType_IsSubtype(tinfo[i]->type, tinfo[vh.index]->type) != 0) {
                return true;
            }
        }
        return false;
    }